

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.h
# Opt level: O0

void __thiscall
ConditionalMeaning::TracePointers(ConditionalMeaning *this,function<void_(Sexp_**)> *func)

{
  function<void_(Sexp_**)> *func_local;
  ConditionalMeaning *this_local;
  
  std::function<void_(Sexp_**)>::operator()(func,&this->condition);
  std::function<void_(Sexp_**)>::operator()(func,&this->true_branch);
  std::function<void_(Sexp_**)>::operator()(func,&this->false_branch);
  return;
}

Assistant:

void TracePointers(std::function<void(Sexp **)> func) override {
    func(&condition);
    func(&true_branch);
    func(&false_branch);
  }